

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

REJECTED_HANDLE rejected_create(void)

{
  REJECTED_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (REJECTED_HANDLE)malloc(8);
  if (__ptr != (REJECTED_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x25);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (REJECTED_HANDLE)0x0;
}

Assistant:

REJECTED_HANDLE rejected_create(void)
{
    REJECTED_INSTANCE* rejected_instance = (REJECTED_INSTANCE*)malloc(sizeof(REJECTED_INSTANCE));
    if (rejected_instance != NULL)
    {
        rejected_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(37);
        if (rejected_instance->composite_value == NULL)
        {
            free(rejected_instance);
            rejected_instance = NULL;
        }
    }

    return rejected_instance;
}